

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::startElement(XmlWriter *this,string *name,XmlFormatting fmt)

{
  bool bVar1;
  ostream *poVar2;
  undefined4 in_EDX;
  string *in_RSI;
  XmlWriter *in_RDI;
  XmlFormatting in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  
  ensureTagClosed(in_RDI);
  newlineIfNecessary(in_RDI);
  bVar1 = anon_unknown_1::shouldIndent(None);
  if (bVar1) {
    std::operator<<(in_RDI->m_os,(string *)&in_RDI->m_indent);
    std::__cxx11::string::operator+=((string *)&in_RDI->m_indent,"  ");
  }
  poVar2 = std::operator<<(in_RDI->m_os,'<');
  std::operator<<(poVar2,in_RSI);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RSI,(value_type *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  in_RDI->m_tagIsOpen = true;
  applyFormatting(in_RDI,in_stack_ffffffffffffffdc);
  return in_RDI;
}

Assistant:

XmlWriter& XmlWriter::startElement( std::string const& name, XmlFormatting fmt ) {
        ensureTagClosed();
        newlineIfNecessary();
        if (shouldIndent(fmt)) {
            m_os << m_indent;
            m_indent += "  ";
        }
        m_os << '<' << name;
        m_tags.push_back( name );
        m_tagIsOpen = true;
        applyFormatting(fmt);
        return *this;
    }